

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O0

optional<unsigned_long_long> __thiscall
yactfr::internal::StrScanner::_tryScanConstInt<unsigned_long_long,10>(StrScanner *this,bool negate)

{
  bool bVar1;
  int iVar2;
  Size SVar3;
  StrScanner *extraout_RAX;
  StrScanner *extraout_RAX_00;
  ulonglong ullVal_00;
  int *piVar4;
  StrScanner *extraout_RAX_01;
  undefined7 extraout_var;
  StrScanner *pSVar5;
  optional<unsigned_long_long> oVar6;
  unsigned_long_long ullVal;
  char *strEnd;
  StrScanner *pSStack_28;
  bool negate_local;
  StrScanner *this_local;
  optional<unsigned_long_long> val;
  
  strEnd._7_1_ = negate;
  pSStack_28 = this;
  SVar3 = charsLeft(this);
  if (((SVar3 < 2) || (*this->_at != '0')) || ((this->_at[1] != 'x' && (this->_at[1] != 'X')))) {
    SVar3 = charsLeft(this);
    if ((SVar3 == 0) || (iVar2 = isxdigit((int)*this->_at), iVar2 != 0)) {
      ullVal = 0;
      ullVal_00 = strtoull(this->_at,(char **)&ullVal,10);
      if (((ullVal_00 == 0) && (this->_at == (char *)ullVal)) ||
         (piVar4 = __errno_location(), *piVar4 == 0x22)) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        boost::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&this_local);
        pSVar5 = extraout_RAX_01;
      }
      else {
        oVar6 = _tryNegateConstInt<unsigned_long_long>(ullVal_00,(bool)(strEnd._7_1_ & 1));
        val.super_type._0_8_ = oVar6.super_type.m_storage;
        this_local._0_1_ = oVar6.super_type.m_initialized;
        val.super_type.m_storage = (unsigned_long_long)&this_local;
        bVar1 = boost::optional<unsigned_long_long>::operator!
                          ((optional<unsigned_long_long> *)val.super_type.m_storage);
        pSVar5 = (StrScanner *)(CONCAT71(extraout_var,bVar1) ^ 0xff);
        if (((ulong)pSVar5 & 1) != 0) {
          this->_at = this->_at + (ullVal - (long)this->_at);
          pSVar5 = this;
        }
      }
    }
    else {
      boost::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&this_local);
      pSVar5 = extraout_RAX_00;
    }
  }
  else {
    boost::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&this_local);
    pSVar5 = extraout_RAX;
  }
  oVar6.super_type._1_7_ = (undefined7)((ulong)pSVar5 >> 8);
  oVar6.super_type.m_initialized = (bool)this_local._0_1_;
  oVar6.super_type.m_storage = val.super_type._0_8_;
  return (optional<unsigned_long_long>)oVar6.super_type;
}

Assistant:

boost::optional<ValT> StrScanner::_tryScanConstInt(const bool negate)
{
    /*
     * Only accept hex characters for the first two characters at this
     * point, as std::strtoull() will accept a hexadecimal radix prefix,
     * whitespaces, `-`, and `+`.
     */
    if (this->charsLeft() >= 2 && _at[0] == '0') {
        if (_at[1] == 'x' || _at[1] == 'X') {
            // we already scanned any prefix, if allowed
            return boost::none;
        }
    }

    if (this->charsLeft() >= 1 && !std::isxdigit(*_at)) {
        return boost::none;
    }

    char *strEnd = nullptr;
    const auto ullVal = std::strtoull(_at, &strEnd, BaseV);

    if ((ullVal == 0 && &(*_at) == strEnd) || errno == ERANGE) {
        // could not parse
        errno = 0;
        return boost::none;
    }

    {
        const auto val = this->_tryNegateConstInt<ValT>(ullVal, negate);

        if (val) {
            // success: update position
            _at += (strEnd - &(*_at));
        }

        return val;
    }
}